

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupSelectConfigAutoMap(CEditor *this,void *pContext,CUIRect View)

{
  long lVar1;
  IAutoMapper *pIVar2;
  int iVar3;
  CLayer *pCVar4;
  undefined4 extraout_var;
  int *pID;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  CUIRect Live;
  CUIRect Full;
  CUIRect Label;
  CUIRect Button;
  CUIRect View_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  View_local = View;
  pCVar4 = GetSelectedLayer(this,0);
  pID = PopupSelectConfigAutoMap::s_AutoMapperConfigButtons;
  do {
    iVar3 = (*(this->m_Map).m_lImages.list[*(int *)&pCVar4[1].m_pEditor]->m_pAutoMapper->
              _vptr_IAutoMapper[5])();
    if ((long)iVar3 <= (long)uVar6) goto LAB_0019b597;
    uVar5 = 0;
    CUIRect::HSplitTop(&View_local,2.0,(CUIRect *)0x0,&View_local);
    CUIRect::HSplitTop(&View_local,12.0,&Button,&View_local);
    pIVar2 = (this->m_Map).m_lImages.list[*(int *)&pCVar4[1].m_pEditor]->m_pAutoMapper;
    iVar3 = (*pIVar2->_vptr_IAutoMapper[6])(pIVar2,uVar6 & 0xffffffff);
    if (pCVar4[2].m_Readonly == true) {
      uVar5 = (uint)(uVar6 == (uint)pCVar4[2].m_Flags);
    }
    iVar3 = DoButton_Editor(this,pID,(char *)CONCAT44(extraout_var,iVar3),uVar5,&Button,0,
                            (char *)0x0);
    uVar6 = uVar6 + 1;
    pID = pID + 1;
  } while (iVar3 == 0);
  pCVar4[2].m_Flags = (int)uVar6 + -1;
  if (pCVar4[2].m_Readonly == false) {
    s_AutoMapProceedOrder = 1;
  }
LAB_0019b597:
  uVar5 = 0;
  CUIRect::HSplitTop(&View_local,2.0,(CUIRect *)0x0,&View_local);
  CUIRect::VSplitMid(&View_local,&Label,&View_local,0.0);
  CUI::DoLabel(&this->m_UI,&Label,"Type",10.0,0,-1.0,true);
  CUIRect::VSplitMid(&View_local,&Full,&Live,0.0);
  iVar3 = DoButton_ButtonDec(this,PopupSelectConfigAutoMap::s_aIds,"Full",pCVar4[2].m_Readonly ^ 1,
                             &Full,0,"");
  if (iVar3 == 0) {
    uVar5 = (uint)pCVar4[2].m_Readonly;
  }
  else {
    pCVar4[2].m_Readonly = false;
  }
  iVar3 = DoButton_ButtonInc(this,(void *)((long)PopupSelectConfigAutoMap::s_aIds + 1),"Live",uVar5,
                             &Live,0,"");
  if (iVar3 != 0) {
    pCVar4[2].m_Readonly = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupSelectConfigAutoMap(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayerTiles *pLayer = static_cast<CLayerTiles*>(pEditor->GetSelectedLayer(0));
	CUIRect Button;
	static int s_AutoMapperConfigButtons[IAutoMapper::MAX_RULES];

	for(int i = 0; i < pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper->RuleSetNum(); ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_AutoMapperConfigButtons[i], pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper->GetRuleSetName(i), pLayer->m_LiveAutoMap && pLayer->m_SelectedRuleSet == i, &Button, 0, 0))
		{
			pLayer->m_SelectedRuleSet = i;
			if(!pLayer->m_LiveAutoMap)
				s_AutoMapProceedOrder = true;
			break;
		}
	}

	View.HSplitTop(2.0f, 0, &View);

	static int s_aIds[2] = {0};

	CUIRect Label, Full, Live;
	View.VSplitMid(&Label, &View);
	pEditor->UI()->DoLabel(&Label, "Type", 10.0f, TEXTALIGN_LEFT);

	View.VSplitMid(&Full, &Live);
	if(pEditor->DoButton_ButtonDec(&s_aIds[0], "Full", !pLayer->m_LiveAutoMap, &Full, 0, ""))
	{
		pLayer->m_LiveAutoMap = false;
	}
	if(pEditor->DoButton_ButtonInc(((char *)&s_aIds[0])+1, "Live", pLayer->m_LiveAutoMap, &Live, 0, ""))
	{
		pLayer->m_LiveAutoMap = true;
	}

	return false;
}